

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMS_ECC_POINT_Unmarshal(TPMS_ECC_POINT *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = TPM2B_ECC_PARAMETER_Unmarshal(&target->x,buffer,size);
  if (TVar1 != 0) {
    return TVar1;
  }
  TVar1 = TPM2B_ECC_PARAMETER_Unmarshal(&target->y,buffer,size);
  return TVar1;
}

Assistant:

TPM_RC
TPMS_ECC_POINT_Unmarshal(TPMS_ECC_POINT *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM2B_ECC_PARAMETER_Unmarshal((TPM2B_ECC_PARAMETER *)&(target->x), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_ECC_PARAMETER_Unmarshal((TPM2B_ECC_PARAMETER *)&(target->y), buffer, size);
    return result;
}